

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::setKernelArgUSMPointer(CLIntercept *this,cl_kernel kernel,cl_uint arg_index,void *arg)

{
  mapped_type pvVar1;
  iterator iVar2;
  mapped_type *this_00;
  mapped_type *ppvVar3;
  mapped_type pvVar4;
  cl_uint local_34;
  mapped_type local_30;
  cl_kernel local_28;
  
  local_34 = arg_index;
  local_30 = arg;
  local_28 = kernel;
  std::mutex::lock(&this->m_Mutex);
  if ((this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    iVar2 = std::
            _Rb_tree<const_void_*,_std::pair<const_void_*const,_unsigned_long>,_std::_Select1st<std::pair<const_void_*const,_unsigned_long>_>,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_unsigned_long>_>_>
            ::lower_bound(&(this->m_USMAllocInfoMap)._M_t,&local_30);
    pvVar1 = local_30;
    if (((_Rb_tree_header *)iVar2._M_node ==
         &(this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header) ||
       ((pvVar4 = *(mapped_type *)(iVar2._M_node + 1), pvVar4 != local_30 &&
        (iVar2._M_node !=
         (this->m_USMAllocInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left)))) {
      iVar2._M_node = (_Base_ptr)std::_Rb_tree_decrement(iVar2._M_node);
      pvVar4 = *(mapped_type *)(iVar2._M_node + 1);
    }
    if ((pvVar4 <= pvVar1) &&
       (pvVar1 < (mapped_type)((long)&(iVar2._M_node[1]._M_parent)->_M_color + (long)pvVar4))) {
      this_00 = std::
                map<_cl_kernel_*,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_std::map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>_>_>_>
                ::operator[](&this->m_KernelArgMemMap,&local_28);
      ppvVar3 = std::
                map<unsigned_int,_const_void_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_void_*>_>_>
                ::operator[](this_00,&local_34);
      *ppvVar3 = pvVar4;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::setKernelArgUSMPointer(
    cl_kernel kernel,
    cl_uint arg_index,
    const void* arg )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    if( m_USMAllocInfoMap.empty() )
    {
        return;
    }

    CUSMAllocInfoMap::iterator iter = m_USMAllocInfoMap.lower_bound( arg );
    if( iter == m_USMAllocInfoMap.end() || (iter->first != arg && iter != m_USMAllocInfoMap.begin()) )
    {
        // Go to the previous iterator.
        --iter;
    }

    const void* startPtr = iter->first;
    const void* endPtr = (const char*)startPtr + iter->second;
    if( arg >= startPtr && arg < endPtr )
    {
        CArgMemMap& argMemMap = m_KernelArgMemMap[ kernel ];
        argMemMap[ arg_index ] = startPtr;
    }
}